

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

void * HUF_alignUpWorkspace(void *workspace,size_t *workspaceSizePtr,size_t align)

{
  ulong uVar1;
  void *pvVar2;
  ulong uVar3;
  size_t sVar4;
  
  uVar1 = align - 1;
  if ((align & uVar1) != 0) {
    __assert_fail("(align & (align - 1)) == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x3b52,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
  }
  uVar3 = align - (uVar1 & (ulong)workspace) & uVar1;
  pvVar2 = (void *)0x0;
  sVar4 = 0;
  if (uVar3 <= *workspaceSizePtr) {
    if (align == 0) {
      __assert_fail("add < align",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3b55,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
    pvVar2 = (void *)((long)workspace + uVar3);
    sVar4 = *workspaceSizePtr - uVar3;
    if ((uVar1 & (ulong)pvVar2) != 0) {
      __assert_fail("((size_t)aligned & mask) == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                    ,0x3b56,"void *HUF_alignUpWorkspace(void *, size_t *, size_t)");
    }
  }
  *workspaceSizePtr = sVar4;
  return pvVar2;
}

Assistant:

static void* HUF_alignUpWorkspace(void* workspace, size_t* workspaceSizePtr, size_t align)
{
    size_t const mask = align - 1;
    size_t const rem = (size_t)workspace & mask;
    size_t const add = (align - rem) & mask;
    BYTE* const aligned = (BYTE*)workspace + add;
    assert((align & (align - 1)) == 0); /* pow 2 */
    assert(align <= HUF_WORKSPACE_MAX_ALIGNMENT);
    if (*workspaceSizePtr >= add) {
        assert(add < align);
        assert(((size_t)aligned & mask) == 0);
        *workspaceSizePtr -= add;
        return aligned;
    } else {
        *workspaceSizePtr = 0;
        return NULL;
    }
}